

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_window_expression.cpp
# Opt level: O2

void __thiscall
duckdb::BoundWindowExpression::Serialize(BoundWindowExpression *this,Serializer *serializer)

{
  type function;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_18;
  
  Expression::Serialize(&this->super_Expression,serializer);
  Serializer::WriteProperty<duckdb::LogicalType>
            (serializer,200,"return_type",&(this->super_Expression).return_type);
  Serializer::
  WriteProperty<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>>
            (serializer,0xc9,"children",&this->children);
  if ((this->super_Expression).super_BaseExpression.type == WINDOW_AGGREGATE) {
    function = unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>,_true>
               ::operator*(&this->aggregate);
    FunctionSerializer::Serialize<duckdb::AggregateFunction>
              (serializer,function,
               (optional_ptr<duckdb::FunctionData,_true>)
               (this->bind_info).
               super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
               _M_t.
               super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
               .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl);
  }
  Serializer::
  WriteProperty<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>>
            (serializer,0xca,"partitions",&this->partitions);
  Serializer::WriteProperty<duckdb::vector<duckdb::BoundOrderByNode,true>>
            (serializer,0xcb,"orders",&this->orders);
  local_18._M_head_impl = (Expression *)0x0;
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            (serializer,0xcc,"filters",&this->filter_expr,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_18);
  if (local_18._M_head_impl != (Expression *)0x0) {
    (*((local_18._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  Serializer::WriteProperty<bool>(serializer,0xcd,"ignore_nulls",&this->ignore_nulls);
  Serializer::WriteProperty<duckdb::WindowBoundary>(serializer,0xce,"start",&this->start);
  Serializer::WriteProperty<duckdb::WindowBoundary>(serializer,0xcf,"end",&this->end);
  local_18._M_head_impl = (Expression *)0x0;
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            (serializer,0xd0,"start_expr",&this->start_expr,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_18);
  if (local_18._M_head_impl != (Expression *)0x0) {
    (*((local_18._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_18._M_head_impl = (Expression *)0x0;
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            (serializer,0xd1,"end_expr",&this->end_expr,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_18);
  if (local_18._M_head_impl != (Expression *)0x0) {
    (*((local_18._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_18._M_head_impl = (Expression *)0x0;
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            (serializer,0xd2,"offset_expr",&this->offset_expr,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_18);
  if (local_18._M_head_impl != (Expression *)0x0) {
    (*((local_18._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_18._M_head_impl = (Expression *)0x0;
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            (serializer,0xd3,"default_expr",&this->default_expr,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_18);
  if (local_18._M_head_impl != (Expression *)0x0) {
    (*((local_18._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  Serializer::WriteProperty<duckdb::WindowExcludeMode>
            (serializer,0xd4,"exclude_clause",&this->exclude_clause);
  Serializer::WriteProperty<bool>(serializer,0xd5,"distinct",&this->distinct);
  Serializer::WriteProperty<duckdb::vector<duckdb::BoundOrderByNode,true>>
            (serializer,0xd6,"arg_orders",&this->arg_orders);
  return;
}

Assistant:

void BoundWindowExpression::Serialize(Serializer &serializer) const {
	Expression::Serialize(serializer);
	serializer.WriteProperty(200, "return_type", return_type);
	serializer.WriteProperty(201, "children", children);
	if (type == ExpressionType::WINDOW_AGGREGATE) {
		D_ASSERT(aggregate);
		FunctionSerializer::Serialize(serializer, *aggregate, bind_info.get());
	}
	serializer.WriteProperty(202, "partitions", partitions);
	serializer.WriteProperty(203, "orders", orders);
	serializer.WritePropertyWithDefault(204, "filters", filter_expr, unique_ptr<Expression>());
	serializer.WriteProperty(205, "ignore_nulls", ignore_nulls);
	serializer.WriteProperty(206, "start", start);
	serializer.WriteProperty(207, "end", end);
	serializer.WritePropertyWithDefault(208, "start_expr", start_expr, unique_ptr<Expression>());
	serializer.WritePropertyWithDefault(209, "end_expr", end_expr, unique_ptr<Expression>());
	serializer.WritePropertyWithDefault(210, "offset_expr", offset_expr, unique_ptr<Expression>());
	serializer.WritePropertyWithDefault(211, "default_expr", default_expr, unique_ptr<Expression>());
	serializer.WriteProperty(212, "exclude_clause", exclude_clause);
	serializer.WriteProperty(213, "distinct", distinct);
	serializer.WriteProperty(214, "arg_orders", arg_orders);
}